

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

HermiteSpline<3U,_2U> * fit_and_draw_spline<HermiteSpline<3u,2u>>(void)

{
  double *pdVar1;
  long lVar2;
  HermiteSpline<3U,_2U> *in_RDI;
  ulong uVar3;
  Solver solver;
  HermiteSpline<3U,_2U> local_3d8;
  HermiteSpline<3U,_2U> *local_3b0;
  undefined8 local_3a8;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_3a0;
  HermiteSpline<3U,_2U> local_388;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined1 local_358 [24];
  double dStack_340;
  Matrix<double,_2,_1,_0,_2,_1> local_338;
  UnitBoundedPolynomial<3U,_2U> local_328;
  undefined1 local_2c8 [16];
  _func_int *local_2b8;
  double dStack_2b0;
  void *local_2a8;
  void *local_2a0;
  CompressedStorage<double,_int> CStack_298;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> local_278;
  
  (in_RDI->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI->length = 0.0;
  (in_RDI->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2c8;
  local_2b8 = (_func_int *)0x0;
  dStack_2b0 = 0.0;
  local_2c8._0_8_ = (_func_int **)0x0;
  local_2c8._8_8_ = 0.0;
  local_3d8.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_3d8.children.
                         super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xc1020006);
  local_3d8.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x400000001;
  local_3b0 = in_RDI;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&frame,(_InputArray *)&local_3d8);
  if (0x20 < (ulong)((long)points.
                           super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)points.
                          super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    local_2c8._0_8_ = &PTR_find_params_1d_0012d870;
    local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
    local_2b8 = (_func_int *)0xffffffffffffffff;
    dStack_2b0 = 0.0;
    local_2a8 = (void *)0x0;
    local_2a0 = (void *)0x0;
    CStack_298.m_values = (Scalar *)0x0;
    CStack_298.m_indices = (StorageIndex *)0x0;
    CStack_298.m_size = 0;
    CStack_298.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_0,_int>::resize((SparseMatrix<double,_0,_int> *)(local_2c8 + 8),0,0)
    ;
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
              (&local_278);
    std::
    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ::vector(&local_3a0,&points);
    local_338.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_338.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_358._16_8_ = 0.0;
    dStack_340 = 0.0;
    BaseSplineSolver<3U,_2U>::solve
              (&local_3d8,(BaseSplineSolver<3U,_2U> *)local_2c8,&local_3a0,&local_338,
               (Matrix<double,_2,_1,_0,_2,_1> *)(local_358 + 0x10));
    (in_RDI->children).
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_3d8.children.
         super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (in_RDI->children).
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_3d8.children.
         super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (in_RDI->children).
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_3d8.children.
         super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3d8.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in_RDI->length = local_3d8.length;
    if (local_3a0.
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3a0.
                      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3a0.
                            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3a0.
                            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>::
    vector(&local_388.children,&in_RDI->children);
    local_388.length = in_RDI->length;
    cv::Mat::Mat((Mat *)&local_328,&frame.super_Mat);
    local_3d8.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_358;
    local_358._0_8_ = scale;
    local_358._8_8_ = scale;
    local_3d8.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_start = &local_328;
    HermiteSpline<3U,_2U>::walk
              (&local_388,1.0 / SQRT(scale * scale + scale * scale),draw_spline_callback<3u>,
               &local_3d8);
    cv::Mat::~Mat((Mat *)&local_328);
    if (local_388.children.
        super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_388.children.
                      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_388.children.
                            super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_388.children.
                            super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_2c8._0_8_ = &PTR_find_params_1d_0012d870;
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
              (&local_278);
    free(local_2a8);
    free(local_2a0);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&CStack_298);
  }
  if (points.
      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      points.
      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
    local_368 = 0;
    uStack_364 = 0;
    uStack_360 = 0;
    uStack_35c = 0x3ff00000;
    uVar3 = 0;
    do {
      local_3d8.children.
      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3d8.children.
      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_3d8.children.
                             super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x83010015);
      local_3d8.children.
      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&frame;
      pdVar1 = (double *)
               ((long)((points.
                        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                      .array + lVar2);
      local_3a8 = CONCAT44((int)(scale * pdVar1[1]),(int)(scale * *pdVar1));
      local_2c8._0_8_ = CONCAT44(uStack_364,local_368);
      local_2c8._8_8_ = CONCAT44(uStack_35c,uStack_360);
      local_2b8 = (_func_int *)0x0;
      dStack_2b0 = 0.0;
      cv::circle(&local_3d8,&local_3a8,5,local_2c8,0xffffffff,8,0);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)points.
                                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)points.
                                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_2c8._0_8_ = &local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"w1","");
  local_3d8.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_3d8.children.
                         super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x81010015);
  local_3d8.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&frame;
  cv::imshow((string *)local_2c8,(_InputArray *)&local_3d8);
  if ((_func_int **)local_2c8._0_8_ != &local_2b8) {
    operator_delete((void *)local_2c8._0_8_,(ulong)(local_2b8 + 1));
  }
  return local_3b0;
}

Assistant:

Spline fit_and_draw_spline()
{
    Spline sp;

    frame.setTo(Scalar(0.0f,0.0f, 0.0f)); // clear frame

    if (points.size() >= 3)
    {
        typename Spline::Solver solver;

        Matrix<double, 2, Spline::Polynomial1::RequiredValues - 1> start;
        Matrix<double, 2, Spline::Polynomial1::RequiredValues - 1> end;

        start.setZero();
        end.setZero();

        sp = solver.solve(points, start, end);
        draw_spline(sp, frame, Vector2d(scale, scale));
    }

    for (int k = 0; k < points.size(); ++k)
    {
        circle(frame, Point((int)(points[k].x() * scale), (int)(points[k].y() * scale)), 5.0, Scalar(0.0f, 1.0f, 0.0f), FILLED);
    }

    imshow(WINDOW1, frame);

    return sp;
}